

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.h
# Opt level: O0

int __thiscall absl::lts_20240722::flags_internal::Flag<int>::Get(Flag<int> *this)

{
  bool bVar1;
  _func_type_info_ptr *p_Var2;
  int local_14;
  Flag<int> *pFStack_10;
  U u;
  Flag<int> *this_local;
  
  pFStack_10 = this;
  Get::U::U((U *)&local_14);
  p_Var2 = (_func_type_info_ptr *)base_internal::FastTypeId<int>();
  absl::lts_20240722::flags_internal::FlagImpl::AssertValidType(this,p_Var2);
  bVar1 = FlagValue<int,_(absl::lts_20240722::flags_internal::FlagValueStorageKind)0>::Get
                    (&this->value_,(SequenceLock *)&this->field_0x30,&local_14);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FlagImpl::Read<int,_0>(&this->impl_,&local_14);
  }
  Get::U::~U((U *)&local_14);
  return local_14;
}

Assistant:

T Get() const {
    // See implementation notes in CommandLineFlag::Get().
    union U {
      T value;
      U() {}
      ~U() { value.~T(); }
    };
    U u;

#if !defined(NDEBUG)
    impl_.AssertValidType(base_internal::FastTypeId<T>(), &GenRuntimeTypeId<T>);
#endif

    if (ABSL_PREDICT_FALSE(!value_.Get(impl_.seq_lock_, u.value))) {
      impl_.Read(&u.value);
    }
    return std::move(u.value);
  }